

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_Common.cpp
# Opt level: O3

bool HasIntegerMembersInRange
               (ExternTypeInfo *type,uint fromOffset,uint toOffset,ExternTypeInfo *exTypes,
               ExternMemberInfo *exTypeExtra)

{
  TypeCategory TVar1;
  bool bVar2;
  ulong uVar3;
  ExternTypeInfo *type_00;
  ulong uVar4;
  uint uVar5;
  bool bVar6;
  
  uVar4 = (ulong)(type->field_8).arrSize;
  if (uVar4 == 0) {
    bVar6 = false;
  }
  else {
    uVar5 = (type->field_11).subType;
    bVar6 = true;
    uVar3 = 1;
    do {
      TVar1 = exTypes[exTypeExtra[uVar5].type].type;
      if ((TVar1 != TYPE_DOUBLE) && (TVar1 != TYPE_FLOAT)) {
        type_00 = exTypes + exTypeExtra[uVar5].type;
        if ((TVar1 == TYPE_COMPLEX) &&
           ((type_00->subCat == CAT_CLASS && ((type_00->field_8).arrSize != 0)))) {
          bVar2 = HasIntegerMembersInRange
                            (type_00,fromOffset - exTypeExtra[uVar5].offset,
                             toOffset - exTypeExtra[uVar5].offset,exTypes,exTypeExtra);
          if (bVar2) {
            return bVar6;
          }
        }
        else if ((exTypeExtra[uVar5].offset < toOffset) &&
                (fromOffset < exTypeExtra[uVar5].offset + type_00->size)) {
          return bVar6;
        }
      }
      bVar6 = uVar3 < uVar4;
      uVar5 = uVar5 + 1;
      bVar2 = uVar3 != uVar4;
      uVar3 = uVar3 + 1;
    } while (bVar2);
  }
  return bVar6;
}

Assistant:

bool HasIntegerMembersInRange(ExternTypeInfo &type, unsigned fromOffset, unsigned toOffset, ExternTypeInfo *exTypes, ExternMemberInfo *exTypeExtra)
{
	for(unsigned m = 0; m < type.memberCount; m++)
	{
		ExternMemberInfo &member = exTypeExtra[type.memberOffset + m];

		ExternTypeInfo &memberType = exTypes[member.type];

		if(memberType.type == ExternTypeInfo::TYPE_COMPLEX)
		{
			// Handle opaque types
			bool opaqueType = memberType.subCat != ExternTypeInfo::CAT_CLASS || memberType.memberCount == 0;

			if(opaqueType)
			{
				if(member.offset + memberType.size > fromOffset && member.offset < toOffset)
					return true;
			}
			else
			{
				if(HasIntegerMembersInRange(memberType, fromOffset - member.offset, toOffset - member.offset, exTypes, exTypeExtra))
					return true;
			}
		}
		else if(memberType.type != ExternTypeInfo::TYPE_FLOAT && memberType.type != ExternTypeInfo::TYPE_DOUBLE)
		{
			if(member.offset + memberType.size > fromOffset && member.offset < toOffset)
				return true;
		}
	}

	return false;
}